

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_writer.cpp
# Opt level: O0

string * __thiscall
duckdb::FixedDecimalStatistics::GetStats_abi_cxx11_(FixedDecimalStatistics *this,hugeint_t *input)

{
  char *pcVar1;
  undefined8 *in_RDX;
  string *in_RDI;
  data_ptr_t in_stack_00000010;
  hugeint_t in_stack_00000018;
  data_t buffer [16];
  allocator local_39;
  undefined8 local_38;
  undefined8 uStack_30;
  uchar local_28 [40];
  
  local_38 = *in_RDX;
  uStack_30 = in_RDX[1];
  WriteParquetDecimal(in_stack_00000018,in_stack_00000010);
  pcVar1 = const_char_ptr_cast<unsigned_char>(local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,pcVar1,0x10,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return in_RDI;
}

Assistant:

string GetStats(hugeint_t &input) {
		data_t buffer[16];
		WriteParquetDecimal(input, buffer);
		return string(const_char_ptr_cast(buffer), 16);
	}